

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O2

int blake2s_init(blake2s_state *S,size_t outlen)

{
  blake2s_param P [1];
  blake2s_param local_28;
  
  if (outlen - 0x21 < 0xffffffffffffffe0) {
    return -1;
  }
  local_28.digest_length = (uint8_t)outlen;
  local_28.key_length = '\0';
  local_28.fanout = '\x01';
  local_28.depth = '\x01';
  local_28.leaf_length = 0;
  local_28.node_offset = 0;
  local_28.xof_length = 0;
  local_28.node_depth = '\0';
  local_28.inner_length = '\0';
  local_28.salt[0] = '\0';
  local_28.salt[1] = '\0';
  local_28.salt[2] = '\0';
  local_28.salt[3] = '\0';
  local_28.salt[4] = '\0';
  local_28.salt[5] = '\0';
  local_28.salt[6] = '\0';
  local_28.salt[7] = '\0';
  local_28.personal[0] = '\0';
  local_28.personal[1] = '\0';
  local_28.personal[2] = '\0';
  local_28.personal[3] = '\0';
  local_28.personal[4] = '\0';
  local_28.personal[5] = '\0';
  local_28.personal[6] = '\0';
  local_28.personal[7] = '\0';
  blake2s_init_param(S,&local_28);
  return 0;
}

Assistant:

int blake2s_init( blake2s_state *S, size_t outlen )
{
  blake2s_param P[1];

  /* Move interval verification here? */
  if ( ( !outlen ) || ( outlen > BLAKE2S_OUTBYTES ) ) return -1;

  P->digest_length = (uint8_t)outlen;
  P->key_length    = 0;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store32( &P->node_offset, 0 );
  store16( &P->xof_length, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  /* memset(P->reserved, 0, sizeof(P->reserved) ); */
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );
  return blake2s_init_param( S, P );
}